

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

float __thiscall
xatlas::internal::segment::Atlas::evaluateStraightnessMetric
          (Atlas *this,Chart *chart,uint32_t firstFace)

{
  uint uVar1;
  float fVar2;
  bool bVar3;
  uint32_t uVar4;
  uint *puVar5;
  float *pfVar6;
  int *piVar7;
  uint index;
  float fVar8;
  float fVar9;
  FaceEdgeIterator it;
  float local_74;
  float local_70;
  FaceEdgeIterator local_60;
  Array<unsigned_int> *local_48;
  Atlas *local_40;
  Chart *local_38;
  
  local_38 = chart;
  puVar5 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,firstFace);
  uVar1 = *puVar5;
  local_48 = &this->m_nextPlanarRegionFace;
  local_70 = 0.0;
  local_74 = 0.0;
  index = firstFace;
  local_40 = this;
  do {
    local_60.m_mesh = local_40->m_mesh;
    local_60.m_relativeEdge = 0;
    local_60.m_edge = index * 3;
    local_60.m_face = index;
    while (local_60.m_relativeEdge != 3) {
      pfVar6 = Array<float>::operator[](&this->m_edgeLengths,local_60.m_edge);
      fVar9 = *pfVar6;
      bVar3 = Mesh::FaceEdgeIterator::isBoundary(&local_60);
      fVar8 = local_74 + fVar9;
      fVar2 = fVar8;
      if (!bVar3) {
        uVar4 = Mesh::FaceEdgeIterator::oppositeFace(&local_60);
        puVar5 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,uVar4);
        fVar2 = local_74;
        if (*puVar5 != uVar1) {
          uVar4 = Mesh::FaceEdgeIterator::oppositeFace(&local_60);
          piVar7 = Array<int>::operator[](&this->m_faceCharts,uVar4);
          fVar2 = fVar8;
          if (*piVar7 == local_38->id) {
            local_70 = local_70 + fVar9;
            fVar2 = local_74;
          }
        }
      }
      local_74 = fVar2;
      if (local_60.m_relativeEdge < 3) {
        local_60.m_edge = local_60.m_edge + 1;
        local_60.m_relativeEdge = local_60.m_relativeEdge + 1;
      }
    }
    puVar5 = Array<unsigned_int>::operator[](local_48,index);
    index = *puVar5;
  } while (index != firstFace);
  if ((local_70 == 0.0) && (!NAN(local_70))) {
    __assert_fail("l_in != 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x157f,
                  "float xatlas::internal::segment::Atlas::evaluateStraightnessMetric(Chart *, uint32_t) const"
                 );
  }
  fVar9 = (local_74 - local_70) / (local_70 + local_74);
  if (0.0 <= fVar9) {
    fVar9 = 0.0;
  }
  return fVar9;
}

Assistant:

float evaluateStraightnessMetric(Chart *chart, uint32_t firstFace) const
	{
		float l_out = 0.0f, l_in = 0.0f;
		const uint32_t planarRegionId = m_facePlanarRegionId[firstFace];
		uint32_t face = firstFace;
		for (;;) { 
			for (Mesh::FaceEdgeIterator it(m_mesh, face); !it.isDone(); it.advance()) {
				const float l = m_edgeLengths[it.edge()];
				if (it.isBoundary()) {
					l_out += l;
				} else if (m_facePlanarRegionId[it.oppositeFace()] != planarRegionId) {
					if (m_faceCharts[it.oppositeFace()] != chart->id)
						l_out += l;
					else
						l_in += l;
				}
			}
			face = m_nextPlanarRegionFace[face];
			if (face == firstFace)
				break;
		}
		XA_DEBUG_ASSERT(l_in != 0.0f); // Candidate face must be adjacent to chart. @@ This is not true if the input mesh has zero-length edges.
		float ratio = (l_out - l_in) / (l_out + l_in);
		return min(ratio, 0.0f); // Only use the straightness metric to close gaps.
	}